

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateJSBooleanTest
          (Lowerer *this,RegOpnd *regSrc,Instr *insertInstr,LabelInstr *labelTarget,
          bool fContinueLabel)

{
  ScriptContextInfo *pSVar1;
  LabelInstr *pLVar2;
  bool bVar3;
  int iVar4;
  IndirOpnd *src1;
  undefined4 extraout_var;
  AddrOpnd *src2;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  LabelInstr *local_38;
  
  local_3a = (regSrc->super_Opnd).m_valueType.field_0;
  local_38 = labelTarget;
  bVar3 = ValueType::IsBoolean((ValueType *)&local_3a.field_0);
  pLVar2 = local_38;
  if (bVar3) {
    if (fContinueLabel) {
      InsertBranch(Br,false,local_38,insertInstr);
      if ((pLVar2->field_0x78 & 2) != 0) {
        local_38->field_0x78 = pLVar2->field_0x78 | 0x20;
      }
    }
  }
  else {
    src1 = IR::IndirOpnd::New(regSrc,0,TyUint64,this->m_func,false);
    pSVar1 = insertInstr->m_func->m_scriptContextInfo;
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,6);
    src2 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var,iVar4),AddrOpndKindDynamicVtable,
                             this->m_func,false,(Var)0x0);
    InsertCompare(&src1->super_Opnd,&src2->super_Opnd,insertInstr);
    if (fContinueLabel) {
      InsertBranch(BrEq_A,false,local_38,insertInstr);
      InsertLabel(true,insertInstr);
    }
    else {
      InsertBranch(BrNeq_A,false,local_38,insertInstr);
    }
  }
  return !bVar3;
}

Assistant:

bool Lowerer::GenerateJSBooleanTest(IR::RegOpnd * regSrc, IR::Instr * insertInstr, IR::LabelInstr * labelTarget, bool fContinueLabel)
{
    if (regSrc->GetValueType().IsBoolean())
    {
        if (fContinueLabel)
        {
            // JMP $labelTarget
            InsertBranch(Js::OpCode::Br, labelTarget, insertInstr);
#if DBG
            if (labelTarget->isOpHelper)
            {
                labelTarget->m_noHelperAssert = true;
            }
#endif
        }
        return false;
    }

    IR::IndirOpnd * vtablePtrOpnd = IR::IndirOpnd::New(regSrc, 0, TyMachPtr, this->m_func);
    IR::Opnd * jsBooleanVTable = LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptBoolean);
    InsertCompare(vtablePtrOpnd, jsBooleanVTable, insertInstr);

    if (fContinueLabel)
    {
        // JEQ $labelTarget
        InsertBranch(Js::OpCode::BrEq_A, labelTarget, insertInstr);

        // $helper
        InsertLabel(true, insertInstr);
    }
    else
    {
        // JNE $labelTarget
        InsertBranch(Js::OpCode::BrNeq_A, labelTarget, insertInstr);
    }
    return true;
}